

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metal.h
# Opt level: O2

void __thiscall
phyr::MetalMaterial::MetalMaterial
          (MetalMaterial *this,shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *eta,
          shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *k,
          shared_ptr<phyr::Texture<double>_> *rough,shared_ptr<phyr::Texture<double>_> *urough,
          shared_ptr<phyr::Texture<double>_> *vrough,bool remapRoughness)

{
  (this->super_Material)._vptr_Material = (_func_int **)&PTR_computeScatteringFunctions_00197f40;
  std::__shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->eta).
              super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>,
             &eta->
              super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->k).
              super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>,
             &k->
              super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->roughness).
              super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>,
             &rough->super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->uRoughness).
              super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>,
             &urough->super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->vRoughness).
              super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>,
             &vrough->super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>);
  this->remapRoughness = remapRoughness;
  return;
}

Assistant:

MetalMaterial(const std::shared_ptr<Texture<Spectrum>>& eta,
                  const std::shared_ptr<Texture<Spectrum>>& k,
                  const std::shared_ptr<Texture<Real>>& rough,
                  const std::shared_ptr<Texture<Real>>& urough,
                  const std::shared_ptr<Texture<Real>>& vrough,
                  bool remapRoughness) :
        eta(eta), k(k), roughness(rough), uRoughness(urough),
        vRoughness(vrough), remapRoughness(remapRoughness) {}